

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O3

NDSTATUS NdFetchVex2(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  uint uVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,Offset) & 0xffffffff;
  if (Size < uVar3 + 2) {
    return 0x80000001;
  }
  if (((*(uint *)Instrux & 3) == 2) || (0xbf < Code[uVar3 + 1])) {
    if ((*(uint *)&Instrux->field_0x5 & 0x3a3) != 0) {
      return 0x80000007;
    }
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 4;
    *(uint *)Instrux = *(uint *)Instrux & 0xffc0ffff | 0x20000;
    (Instrux->field_73).Rex = *(ND_REX *)(Code + uVar3);
    bVar2 = Code[uVar3 + 1];
    *(byte *)((long)&Instrux->field_73 + 1) = bVar2;
    uVar1 = (uint)bVar2;
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uVar1 & 3) * 0x80 + 0x200 +
                   ((uVar1 & 4) << 0xc |
                   (~uVar1 & 0x78) << 0xd |
                   ((uint)Instrux->Exs & 0xfff0007d) + (uint)(-1 < (char)bVar2) * 2));
    bVar2 = Instrux->Length + 2;
    Instrux->Length = bVar2;
    if (0xf < bVar2) {
      return 0x80000003;
    }
  }
  return 0;
}

Assistant:

static NDSTATUS
NdFetchVex2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    // One more byte has to follow, the modrm or the second VEX byte.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    // VEX is available only in 32 & 64 bit mode.
    if ((ND_CODE_64 == Instrux->DefCode) || ((Code[Offset + 1] & 0xC0) == 0xC0))
    {
        // Make sure we don't have any other prefix.
        if (Instrux->HasOpSize || 
            Instrux->HasRepnzXacquireBnd ||
            Instrux->HasRepRepzXrelease || 
            Instrux->HasRex || 
            Instrux->HasRex2 || 
            Instrux->HasLock)
        {
            return ND_STATUS_VEX_WITH_PREFIX;
        }

        // Fill in VEX2 info.
        Instrux->VexMode = ND_VEXM_2B;
        Instrux->HasVex = ND_TRUE;
        Instrux->EncMode = ND_ENCM_VEX;
        Instrux->Vex2.Vex[0] = Code[Offset];
        Instrux->Vex2.Vex[1] = Code[Offset + 1];

        Instrux->Exs.m = 1; // For VEX2 instructions, always use the second table.
        Instrux->Exs.r = (ND_UINT32)~Instrux->Vex2.r;
        Instrux->Exs.v = (ND_UINT32)~Instrux->Vex2.v;
        Instrux->Exs.l = Instrux->Vex2.l;
        Instrux->Exs.p = Instrux->Vex2.p;

        // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
        Instrux->Length += 2;
        if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
        {
            return ND_STATUS_INSTRUCTION_TOO_LONG;
        }
    }

    return ND_STATUS_SUCCESS;
}